

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O1

void __thiscall Js::EngineInterfaceObject::Initialize(EngineInterfaceObject *this)

{
  ScriptContext *scriptContext;
  JavascriptLibrary *this_00;
  EngineExtensionObjectBase *pEVar1;
  Recycler *recycler;
  DynamicType *type;
  DynamicObject *pDVar2;
  uint i;
  long lVar3;
  
  recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  lVar3 = 0;
  type = DynamicType::New(scriptContext,TypeIds_Object,
                          (this_00->super_JavascriptLibraryBase).nullValue.ptr,(JavascriptMethod)0x0
                          ,(DynamicTypeHandler *)
                           &DeferredTypeHandler<&Js::EngineInterfaceObject::InitializeCommonNativeInterfaces,Js::DefaultDeferredTypeFilter,false,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar2 = DynamicObject::New(recycler,type);
  Memory::Recycler::WBSetBit((char *)&this->commonNativeInterfaces);
  (this->commonNativeInterfaces).ptr = pDVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->commonNativeInterfaces);
  JavascriptLibrary::AddMember
            (this_00,&this->super_DynamicObject,0x207,(this->commonNativeInterfaces).ptr);
  do {
    pEVar1 = this->engineExtensions[lVar3].ptr;
    if (pEVar1 != (EngineExtensionObjectBase *)0x0) {
      (**pEVar1->_vptr_EngineExtensionObjectBase)();
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void EngineInterfaceObject::Initialize()
    {
        Recycler* recycler = this->GetRecycler();
        ScriptContext* scriptContext = this->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        // CommonNativeInterfaces is used as a prototype for the other native interface objects
        // to share the common APIs without requiring everyone to access EngineInterfaceObject.Common.
        this->commonNativeInterfaces = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, library->GetNull(), nullptr,
            DeferredTypeHandler<InitializeCommonNativeInterfaces>::GetDefaultInstance()));
        library->AddMember(this, Js::PropertyIds::Common, this->commonNativeInterfaces);

        for (uint i = 0; i <= MaxEngineInterfaceExtensionKind; i++)
        {
            if (engineExtensions[i] != nullptr)
            {
                engineExtensions[i]->Initialize();
            }
        }
    }